

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O2

String * __thiscall Args::CmdLine::value(String *__return_storage_ptr__,CmdLine *this,String *name)

{
  int iVar1;
  Command *this_00;
  String *pSVar2;
  undefined4 extraout_var;
  
  this_00 = (Command *)findArgument(this,name);
  if (this_00 == (Command *)0x0) {
LAB_001332bb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    iVar1 = (*(this_00->super_GroupIface).super_ArgIface._vptr_ArgIface[2])(this_00);
    if ((iVar1 == 2) || (iVar1 == 1)) {
      iVar1 = (*(this_00->super_GroupIface).super_ArgIface._vptr_ArgIface[0x13])(this_00);
      pSVar2 = (String *)CONCAT44(extraout_var,iVar1);
    }
    else {
      if (iVar1 != 0) goto LAB_001332bb;
      pSVar2 = Command::value_abi_cxx11_(this_00);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pSVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

String value(
		//! Name of the argument. Should be full name, i.e '-a' or '--arg'
		//! or 'add' if it's a command or subcommand.
		const String & name ) const
	{
		const auto * arg = findArgument( name );

		if( arg )
		{
			switch( arg->type() )
			{
				case ArgType::Command :
					return ( static_cast< const Command* > ( arg )->value() );

				case ArgType::Arg :
					return ( static_cast< const Arg* > ( arg )->value() );

				case ArgType::MultiArg :
					return ( static_cast< const MultiArg* > ( arg )->value() );

				default :
					return String();
			}
		}
		else
			return String();
	}